

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::checkRank(Result *__return_storage_ptr__,NeuralNetworkLayer *layer,
                          string *layerType,int min,int max,string *blobType,int rank)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  uint __uval_1;
  uint uVar10;
  uint __uval;
  uint uVar11;
  string __str;
  string err;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  Result *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_98 = __return_storage_ptr__;
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x27,
                  "Result CoreML::checkRank(const Specification::NeuralNetworkLayer &, const std::string &, int, int, const std::string &, int)"
                 );
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cVar2 = (char)(rank >> 0x1f);
  if (((max < 1) || (max != min)) || (rank == max)) {
    if (rank < min && 0 < min) {
      std::operator+(&local_90,"Layer \'",(layer->name_).ptr_);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b8 = &local_a8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_a8 = *plVar4;
        lStack_a0 = puVar5[3];
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*puVar5;
      }
      local_b0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)(layerType->_M_dataplus)._M_p);
      local_118 = &local_108;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_108 = *plVar7;
        lStack_100 = plVar4[3];
      }
      else {
        local_108 = *plVar7;
        local_118 = (long *)*plVar4;
      }
      local_110 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8 = &local_e8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_e8 = *plVar7;
        lStack_e0 = plVar4[3];
      }
      else {
        local_e8 = *plVar7;
        local_f8 = (long *)*plVar4;
      }
      local_f0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_f8,(ulong)(blobType->_M_dataplus)._M_p);
      local_d8 = &local_c8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_c8 = *plVar7;
        lStack_c0 = plVar4[3];
      }
      else {
        local_c8 = *plVar7;
        local_d8 = (long *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_1c8 = *puVar8;
        lStack_1c0 = plVar4[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *puVar8;
        local_1d8 = (ulong *)*plVar4;
      }
      local_1d0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar10 = -rank;
      if (0 < rank) {
        uVar10 = rank;
      }
      uVar11 = 1;
      if (9 < uVar10) {
        uVar9 = (ulong)uVar10;
        uVar3 = 4;
        do {
          uVar11 = uVar3;
          uVar6 = (uint)uVar9;
          if (uVar6 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00318bc6;
          }
          if (uVar6 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00318bc6;
          }
          if (uVar6 < 10000) goto LAB_00318bc6;
          uVar9 = uVar9 / 10000;
          uVar3 = uVar11 + 4;
        } while (99999 < uVar6);
        uVar11 = uVar11 + 1;
      }
LAB_00318bc6:
      local_178 = local_168;
      std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar11 - cVar2);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)rank >> 0x1f) + (long)local_178),uVar11,uVar10);
      uVar9 = 0xf;
      if (local_1d8 != &local_1c8) {
        uVar9 = local_1c8;
      }
      if (uVar9 < (ulong)(local_170 + local_1d0)) {
        uVar9 = 0xf;
        if (local_178 != local_168) {
          uVar9 = local_168[0];
        }
        if (uVar9 < (ulong)(local_170 + local_1d0)) goto LAB_00318c37;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1d8);
      }
      else {
LAB_00318c37:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178);
      }
      local_1b8 = &local_1a8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_1a8 = *plVar4;
        uStack_1a0 = puVar5[3];
      }
      else {
        local_1a8 = *plVar4;
        local_1b8 = (long *)*puVar5;
      }
      local_1b0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_148 = *puVar8;
        lStack_140 = plVar4[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *puVar8;
        local_158 = (ulong *)*plVar4;
      }
      local_150 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar10 = 1;
      if (9 < (uint)min) {
        uVar11 = min;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (uVar11 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_00318d49;
          }
          if (uVar11 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_00318d49;
          }
          if (uVar11 < 10000) goto LAB_00318d49;
          bVar1 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar1);
        uVar10 = uVar10 + 1;
      }
LAB_00318d49:
      local_138 = local_128;
      std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_138,uVar10,min);
      uVar9 = 0xf;
      if (local_158 != &local_148) {
        uVar9 = local_148;
      }
      if (uVar9 < (ulong)(local_130 + local_150)) {
        uVar9 = 0xf;
        if (local_138 != local_128) {
          uVar9 = local_128[0];
        }
        if (uVar9 < (ulong)(local_130 + local_150)) goto LAB_00318dcd;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
      }
      else {
LAB_00318dcd:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138);
      }
      local_198 = &local_188;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_188 = *plVar4;
        uStack_180 = puVar5[3];
      }
      else {
        local_188 = *plVar4;
        local_198 = (long *)*puVar5;
      }
      local_190 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,local_188 + 1);
      }
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      __return_storage_ptr__ = local_98;
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      if (local_178 != local_168) {
        operator_delete(local_178,local_168[0] + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_b8 != &local_a8) goto LAB_0031893e;
    }
    else {
      if (rank <= max || max < 1) {
        Result::Result(__return_storage_ptr__);
        goto LAB_00318984;
      }
      std::operator+(&local_90,"Layer \'",(layer->name_).ptr_);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b8 = &local_a8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_a8 = *plVar4;
        lStack_a0 = puVar5[3];
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*puVar5;
      }
      local_b0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)(layerType->_M_dataplus)._M_p);
      local_118 = &local_108;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_108 = *plVar7;
        lStack_100 = plVar4[3];
      }
      else {
        local_108 = *plVar7;
        local_118 = (long *)*plVar4;
      }
      local_110 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_f8 = &local_e8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_e8 = *plVar7;
        lStack_e0 = plVar4[3];
      }
      else {
        local_e8 = *plVar7;
        local_f8 = (long *)*plVar4;
      }
      local_f0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_f8,(ulong)(blobType->_M_dataplus)._M_p);
      local_d8 = &local_c8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_c8 = *plVar7;
        lStack_c0 = plVar4[3];
      }
      else {
        local_c8 = *plVar7;
        local_d8 = (long *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_1c8 = *puVar8;
        lStack_1c0 = plVar4[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *puVar8;
        local_1d8 = (ulong *)*plVar4;
      }
      local_1d0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar10 = -rank;
      if (0 < rank) {
        uVar10 = rank;
      }
      uVar11 = 1;
      if (9 < uVar10) {
        uVar9 = (ulong)uVar10;
        uVar3 = 4;
        do {
          uVar11 = uVar3;
          uVar6 = (uint)uVar9;
          if (uVar6 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00319006;
          }
          if (uVar6 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00319006;
          }
          if (uVar6 < 10000) goto LAB_00319006;
          uVar9 = uVar9 / 10000;
          uVar3 = uVar11 + 4;
        } while (99999 < uVar6);
        uVar11 = uVar11 + 1;
      }
LAB_00319006:
      local_178 = local_168;
      std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar11 - cVar2);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)rank >> 0x1f) + (long)local_178),uVar11,uVar10);
      uVar9 = 0xf;
      if (local_1d8 != &local_1c8) {
        uVar9 = local_1c8;
      }
      if (uVar9 < (ulong)(local_170 + local_1d0)) {
        uVar9 = 0xf;
        if (local_178 != local_168) {
          uVar9 = local_168[0];
        }
        if (uVar9 < (ulong)(local_170 + local_1d0)) goto LAB_00319078;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1d8);
      }
      else {
LAB_00319078:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178);
      }
      local_1b8 = &local_1a8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_1a8 = *plVar4;
        uStack_1a0 = puVar5[3];
      }
      else {
        local_1a8 = *plVar4;
        local_1b8 = (long *)*puVar5;
      }
      local_1b0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_148 = *puVar8;
        lStack_140 = plVar4[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *puVar8;
        local_158 = (ulong *)*plVar4;
      }
      local_150 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar10 = 1;
      if (9 < (uint)max) {
        uVar11 = max;
        uVar3 = 4;
        do {
          uVar10 = uVar3;
          if (uVar11 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_0031918e;
          }
          if (uVar11 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_0031918e;
          }
          if (uVar11 < 10000) goto LAB_0031918e;
          bVar1 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar3 = uVar10 + 4;
        } while (bVar1);
        uVar10 = uVar10 + 1;
      }
LAB_0031918e:
      local_138 = local_128;
      std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_138,uVar10,max);
      uVar9 = 0xf;
      if (local_158 != &local_148) {
        uVar9 = local_148;
      }
      if (uVar9 < (ulong)(local_130 + local_150)) {
        uVar9 = 0xf;
        if (local_138 != local_128) {
          uVar9 = local_128[0];
        }
        if (uVar9 < (ulong)(local_130 + local_150)) goto LAB_00319213;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
      }
      else {
LAB_00319213:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138);
      }
      local_198 = &local_188;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_188 = *plVar4;
        uStack_180 = puVar5[3];
      }
      else {
        local_188 = *plVar4;
        local_198 = (long *)*puVar5;
      }
      local_190 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,local_188 + 1);
      }
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      __return_storage_ptr__ = local_98;
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      if (local_178 != local_168) {
        operator_delete(local_178,local_168[0] + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_b8 != &local_a8) goto LAB_0031893e;
    }
  }
  else {
    std::operator+(&local_90,"Layer \'",(layer->name_).ptr_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,(ulong)(layerType->_M_dataplus)._M_p);
    local_118 = &local_108;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_108 = *plVar7;
      lStack_100 = plVar4[3];
    }
    else {
      local_108 = *plVar7;
      local_118 = (long *)*plVar4;
    }
    local_110 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_f8 = &local_e8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar4[3];
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)(blobType->_M_dataplus)._M_p);
    local_d8 = &local_c8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_c8 = *plVar7;
      lStack_c0 = plVar4[3];
    }
    else {
      local_c8 = *plVar7;
      local_d8 = (long *)*plVar4;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_1d8 = &local_1c8;
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_1c8 = *puVar8;
      lStack_1c0 = plVar4[3];
    }
    else {
      local_1c8 = *puVar8;
      local_1d8 = (ulong *)*plVar4;
    }
    local_1d0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar10 = -rank;
    if (0 < rank) {
      uVar10 = rank;
    }
    uVar11 = 1;
    if (9 < uVar10) {
      uVar9 = (ulong)uVar10;
      uVar3 = 4;
      do {
        uVar11 = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_003184ea;
        }
        if (uVar6 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_003184ea;
        }
        if (uVar6 < 10000) goto LAB_003184ea;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar11 + 4;
      } while (99999 < uVar6);
      uVar11 = uVar11 + 1;
    }
LAB_003184ea:
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar11 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)rank >> 0x1f) + (long)local_178),uVar11,uVar10);
    uVar9 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar9 = local_1c8;
    }
    if (uVar9 < (ulong)(local_170 + local_1d0)) {
      uVar9 = 0xf;
      if (local_178 != local_168) {
        uVar9 = local_168[0];
      }
      if (uVar9 < (ulong)(local_170 + local_1d0)) goto LAB_00318565;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_1d8);
    }
    else {
LAB_00318565:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178);
    }
    local_1b8 = &local_1a8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_1a8 = *plVar4;
      uStack_1a0 = puVar5[3];
    }
    else {
      local_1a8 = *plVar4;
      local_1b8 = (long *)*puVar5;
    }
    local_1b0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_148 = *puVar8;
      lStack_140 = plVar4[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *puVar8;
      local_158 = (ulong *)*plVar4;
    }
    local_150 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar10 = -min;
    if (0 < min) {
      uVar10 = min;
    }
    uVar11 = 1;
    if (9 < uVar10) {
      uVar9 = (ulong)uVar10;
      uVar3 = 4;
      do {
        uVar11 = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00318685;
        }
        if (uVar6 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00318685;
        }
        if (uVar6 < 10000) goto LAB_00318685;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar11 + 4;
      } while (99999 < uVar6);
      uVar11 = uVar11 + 1;
    }
LAB_00318685:
    local_138 = local_128;
    std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar11 - (char)(min >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_138 + (ulong)((uint)min >> 0x1f)),uVar11,uVar10);
    uVar9 = 0xf;
    if (local_158 != &local_148) {
      uVar9 = local_148;
    }
    if (uVar9 < (ulong)(local_130 + local_150)) {
      uVar9 = 0xf;
      if (local_138 != local_128) {
        uVar9 = local_128[0];
      }
      if (uVar9 < (ulong)(local_130 + local_150)) goto LAB_00318715;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
    }
    else {
LAB_00318715:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138);
    }
    local_198 = &local_188;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_188 = *plVar4;
      uStack_180 = puVar5[3];
    }
    else {
      local_188 = *plVar4;
      local_198 = (long *)*puVar5;
    }
    local_190 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    __return_storage_ptr__ = local_98;
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    if (local_138 != local_128) {
      operator_delete(local_138,local_128[0] + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_b8 != &local_a8) {
LAB_0031893e:
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
LAB_00318984:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result checkRank(const Specification::NeuralNetworkLayer& layer,
                        const std::string &layerType, int min, int max,
                        const std::string &blobType, int rank) {
    
    // blobType: "input" or "output"
    
    assert( min <= max || max < 0 );
    std::string err;
    
    if (max > 0 && max == min && rank != max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType  + " rank " + std::to_string(rank) + " but expects rank exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && rank < min) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && rank > max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else {
        return Result();
    }
}